

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call_detail.hpp
# Opt level: O2

int __thiscall
chaiscript::dispatch::detail::Build_Function_Caller_Helper<int,_int>::call
          (Build_Function_Caller_Helper<int,_int> *this,Function_Params *params,
          Type_Conversions_State *t_state)

{
  int iVar1;
  Boxed_Number BStack_28;
  dispatch local_18 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  dispatch<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>>
            (local_18,&this->m_funcs,params,t_state);
  Boxed_Number::Boxed_Number(&BStack_28,(Boxed_Value *)local_18);
  iVar1 = Boxed_Number::get_as<int>(&BStack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&BStack_28.bv.m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_10);
  return iVar1;
}

Assistant:

Ret call(const chaiscript::Function_Params &params, const Type_Conversions_State &t_state) {
      if constexpr (std::is_arithmetic_v<Ret> && !std::is_same_v<std::remove_cv_t<std::remove_reference_t<Ret>>, bool>) {
        return Boxed_Number(dispatch::dispatch(m_funcs, params, t_state)).get_as<Ret>();
      } else if constexpr (std::is_same_v<void, Ret>) {
        dispatch::dispatch(m_funcs, params, t_state);
      } else {
        return boxed_cast<Ret>(dispatch::dispatch(m_funcs, params, t_state), &t_state);
      }
    }